

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O2

void __thiscall rcg::ImageList::removeOld(ImageList *this,uint64_t timestamp)

{
  pointer psVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    while( true ) {
      psVar1 = (this->list).
               super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->list).
                        super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar2) {
        return;
      }
      if (timestamp <
          (psVar1[uVar2].super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          timestamp) break;
      std::
      vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ::erase(&this->list,psVar1 + (int)uVar2);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void ImageList::removeOld(uint64_t timestamp)
{
  size_t i=0;

  while (i < list.size())
  {
    if (list[i]->getTimestampNS() <= timestamp)
    {
      list.erase(list.begin()+static_cast<int>(i));
    }
    else
    {
      i++;
    }
  }
}